

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQChar sqstd_rex_escapechar(SQRex *exp)

{
  SQChar *pSVar1;
  int iVar2;
  SQRex *in_RDI;
  SQChar *in_stack_ffffffffffffffe8;
  SQChar local_1;
  
  if (*in_RDI->_p == '\\') {
    in_RDI->_p = in_RDI->_p + 1;
    switch(*in_RDI->_p) {
    case 'f':
      in_RDI->_p = in_RDI->_p + 1;
      local_1 = '\f';
      break;
    default:
      pSVar1 = in_RDI->_p;
      in_RDI->_p = pSVar1 + 1;
      local_1 = *pSVar1;
      break;
    case 'n':
      in_RDI->_p = in_RDI->_p + 1;
      local_1 = '\n';
      break;
    case 'r':
      in_RDI->_p = in_RDI->_p + 1;
      local_1 = '\r';
      break;
    case 't':
      in_RDI->_p = in_RDI->_p + 1;
      local_1 = '\t';
      break;
    case 'v':
      in_RDI->_p = in_RDI->_p + 1;
      local_1 = '\v';
    }
  }
  else {
    iVar2 = isprint((int)*in_RDI->_p);
    if (iVar2 == 0) {
      sqstd_rex_error(in_RDI,in_stack_ffffffffffffffe8);
    }
    pSVar1 = in_RDI->_p;
    in_RDI->_p = pSVar1 + 1;
    local_1 = *pSVar1;
  }
  return local_1;
}

Assistant:

static SQChar sqstd_rex_escapechar(SQRex *exp)
{
    if(*exp->_p == SQREX_SYMBOL_ESCAPE_CHAR){
        exp->_p++;
        switch(*exp->_p) {
        case 'v': exp->_p++; return '\v';
        case 'n': exp->_p++; return '\n';
        case 't': exp->_p++; return '\t';
        case 'r': exp->_p++; return '\r';
        case 'f': exp->_p++; return '\f';
        default: return (*exp->_p++);
        }
    } else if(!scisprint(*exp->_p)) sqstd_rex_error(exp,_SC("letter expected"));
    return (*exp->_p++);
}